

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O3

void draco::parser::SkipWhitespace(DecoderBuffer *buffer)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  
  lVar1 = buffer->data_size_;
  lVar4 = buffer->pos_ + 1;
  if (lVar4 <= lVar1) {
    pcVar2 = buffer->data_;
    do {
      iVar3 = isspace((uint)(byte)pcVar2[lVar4 + -1]);
      if (iVar3 == 0) {
        return;
      }
      buffer->pos_ = lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 <= lVar1);
  }
  return;
}

Assistant:

void SkipWhitespace(DecoderBuffer *buffer) {
  bool end_reached = false;
  while (PeekWhitespace(buffer, &end_reached) && !end_reached) {
    // Skip the whitespace character
    buffer->Advance(1);
  }
}